

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int copy_out(archive_write *a,uint64_t offset,uint64_t length)

{
  long *plVar1;
  ulong uVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  __off_t _Var6;
  ssize_t sVar7;
  int *piVar8;
  int *piVar9;
  ulong __nbytes;
  int unaff_EBP;
  
  piVar9 = (int *)a->format_data;
  _Var6 = lseek(*piVar9,offset,0);
  if (_Var6 < 0) {
    piVar9 = __errno_location();
    archive_set_error(&a->archive,*piVar9,"lseek failed");
    unaff_EBP = -0x1e;
  }
  else {
    do {
      if (length == 0) {
        return 0;
      }
      uVar2 = *(ulong *)(piVar9 + 0x4048);
      __nbytes = uVar2;
      if (length < uVar2) {
        __nbytes = length;
      }
      sVar7 = read(*piVar9,(void *)((long)piVar9 + (0x10120 - uVar2)),__nbytes);
      if (sVar7 < 0) {
        piVar8 = __errno_location();
        archive_set_error(&a->archive,*piVar8,"Can\'t read temporary file(%jd)",sVar7);
LAB_00161659:
        bVar4 = false;
        unaff_EBP = -0x1e;
      }
      else {
        if (sVar7 == 0) {
          archive_set_error(&a->archive,0,"Truncated xar archive");
          goto LAB_00161659;
        }
        length = length - sVar7;
        plVar1 = (long *)(piVar9 + 0x4048);
        *plVar1 = *plVar1 - sVar7;
        bVar4 = true;
        if (*plVar1 == 0) {
          pvVar3 = a->format_data;
          iVar5 = __archive_write_output
                            (a,(void *)((long)pvVar3 + 0x120),
                             0x10000 - *(long *)((long)pvVar3 + 0x10120));
          if (iVar5 == 0) {
            *(undefined8 *)((long)pvVar3 + 0x10120) = 0x10000;
          }
          else {
            bVar4 = false;
            unaff_EBP = iVar5;
          }
        }
      }
    } while (bVar4);
  }
  return unaff_EBP;
}

Assistant:

static int
copy_out(struct archive_write *a, uint64_t offset, uint64_t length)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)a->format_data;
	if (lseek(xar->temp_fd, offset, SEEK_SET) < 0) {
		archive_set_error(&(a->archive), errno, "lseek failed");
		return (ARCHIVE_FATAL);
	}
	while (length) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		if (length > xar->wbuff_remaining)
			rsize = xar->wbuff_remaining;
		else
			rsize = (size_t)length;
		wb = xar->wbuff + (sizeof(xar->wbuff) - xar->wbuff_remaining);
		rs = read(xar->temp_fd, wb, rsize);
		if (rs < 0) {
			archive_set_error(&(a->archive), errno,
			    "Can't read temporary file(%jd)",
			    (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		if (rs == 0) {
			archive_set_error(&(a->archive), 0,
			    "Truncated xar archive");
			return (ARCHIVE_FATAL);
		}
		xar->wbuff_remaining -= rs;
		length -= rs;
		if (xar->wbuff_remaining == 0) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
	}
	return (ARCHIVE_OK);
}